

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O3

void __thiscall Timer::~Timer(Timer *this)

{
  pointer ptVar1;
  thread *thread;
  pointer ptVar2;
  
  LOCK();
  (this->tm_running)._M_base._M_i = false;
  UNLOCK();
  std::condition_variable::notify_all();
  if ((this->tm_tick_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::
  _Hashtable<int,_std::pair<const_int,_Timer::IdState>,_std::allocator<std::pair<const_int,_Timer::IdState>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_Timer::IdState>,_std::allocator<std::pair<const_int,_Timer::IdState>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&this->tm_id_state_map);
  LOCK();
  (this->tm_thread_pool).tp_run._M_base._M_i = false;
  UNLOCK();
  std::condition_variable::notify_all();
  ptVar1 = (this->tm_thread_pool).tp_pool.
           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->tm_thread_pool).tp_pool.
                super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    if ((ptVar2->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  std::condition_variable::~condition_variable(&(this->tm_thread_pool).tp_task_cv);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&(this->tm_thread_pool).tp_tasks.c);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&(this->tm_thread_pool).tp_pool);
  if ((this->tm_tick_thread)._M_id._M_thread == 0) {
    std::condition_variable::~condition_variable(&this->tm_cond);
    std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>::~vector
              ((vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_> *)this);
    return;
  }
  std::terminate();
}

Assistant:

~Timer()
    {
        tm_running.store(false);
        tm_cond.notify_all();
        if(tm_tick_thread.joinable())
        {
            tm_tick_thread.join();
        }
    }